

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

int run_container_rank(run_container_t *container,uint16_t x)

{
  ushort uVar1;
  ushort uVar2;
  int in_EAX;
  int iVar3;
  undefined2 in_register_00000032;
  long lVar4;
  uint uVar5;
  int iVar6;
  
  if ((long)container->n_runs < 1) {
    return 0;
  }
  lVar4 = 0;
  iVar3 = 0;
  do {
    uVar1 = container->runs[lVar4].value;
    uVar2 = container->runs[lVar4].length;
    uVar5 = (uint)uVar2 + (uint)uVar1;
    if (uVar5 < CONCAT22(in_register_00000032,x)) {
      iVar3 = iVar3 + (uint)uVar2 + 1;
      iVar6 = 0;
    }
    else {
      iVar6 = 2;
      if (uVar1 <= x) {
        in_EAX = (CONCAT22(in_register_00000032,x) + 1 + iVar3) - (uint)uVar1;
        iVar6 = 1;
      }
    }
    if (CONCAT22(in_register_00000032,x) <= uVar5) goto LAB_001113dd;
    lVar4 = lVar4 + 1;
  } while (container->n_runs != lVar4);
  iVar6 = 2;
LAB_001113dd:
  if (iVar6 == 2) {
    in_EAX = iVar3;
  }
  return in_EAX;
}

Assistant:

int run_container_rank(const run_container_t *container, uint16_t x) {
    int sum = 0;
    uint32_t x32 = x;
    for (int i = 0; i < container->n_runs; i++) {
        uint32_t startpoint = container->runs[i].value;
        uint32_t length = container->runs[i].length;
        uint32_t endpoint = length + startpoint;
        if (x <= endpoint) {
            if (x < startpoint) break;
            return sum + (x32 - startpoint) + 1;
        } else {
            sum += length + 1;
        }
    }
    return sum;
}